

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall sqvector<SQClassMember>::~sqvector(sqvector<SQClassMember> *this)

{
  SQClassMember *pSVar1;
  ulong uVar2;
  long lVar3;
  
  if (this->_allocated != 0) {
    if (this->_size != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        pSVar1 = this->_vals;
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar1->attrs).super_SQObject._type + lVar3));
        SQObjectPtr::~SQObjectPtr
                  ((SQObjectPtr *)((long)&(pSVar1->val).super_SQObject._type + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar2 < this->_size);
    }
    sq_vm_free(this->_vals,this->_allocated << 5);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }